

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O2

CTransactionRef __thiscall
txvalidation_tests::make_tx
          (txvalidation_tests *this,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,
          int32_t version)

{
  undefined8 *puVar1;
  uchar *puVar2;
  pointer pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  CTransactionRef CVar10;
  CMutableTransaction mtx;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&mtx);
  mtx.version = version;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&mtx.vin,((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x24);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&mtx.vout,0x19);
  lVar7 = 0;
  lVar8 = 0;
  for (uVar9 = 0;
      pCVar3 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x24);
      uVar9 = uVar9 + 1) {
    *(undefined4 *)
     ((long)(&((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar8) =
         *(undefined4 *)((long)(&pCVar3->hash + 1) + lVar7);
    puVar1 = (undefined8 *)((long)&(pCVar3->hash).m_wrapped.super_base_blob<256U> + lVar7);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pCVar3->hash).m_wrapped.super_base_blob<256U> + lVar7 + 0x10);
    uVar6 = puVar1[1];
    puVar2 = ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8 + 0x10;
    *(undefined8 *)puVar2 = *puVar1;
    *(undefined8 *)(puVar2 + 8) = uVar6;
    puVar2 = ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8;
    *(undefined8 *)puVar2 = uVar4;
    *(undefined8 *)(puVar2 + 8) = uVar5;
    lVar8 = lVar8 + 0x68;
    lVar7 = lVar7 + 0x24;
  }
  for (lVar7 = 8; lVar7 != 0x3f0; lVar7 = lVar7 + 0x28) {
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    other = &CScript::operator<<((CScript *)local_58,OP_1)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar7),other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
    *(undefined8 *)
     ((long)mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 + -8) = 10000;
  }
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)this);
  CMutableTransaction::~CMutableTransaction(&mtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)
           CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, int32_t version)
{
    CMutableTransaction mtx = CMutableTransaction{};
    mtx.version = version;
    mtx.vin.resize(inputs.size());
    mtx.vout.resize(25);
    for (size_t i{0}; i < inputs.size(); ++i) {
        mtx.vin[i].prevout = inputs[i];
    }
    for (auto i{0}; i < 25; ++i) {
        mtx.vout[i].scriptPubKey = CScript() << OP_TRUE;
        mtx.vout[i].nValue = 10000;
    }
    return MakeTransactionRef(mtx);
}